

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int dump_schema_index(tnt_schema_sval *sval)

{
  mh_int_t mVar1;
  undefined8 *puVar2;
  mh_assoc_t *pmVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  mVar1 = sval->index->n_buckets;
  if (mVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if ((sval->index->b[uVar4 >> 4] >> (uVar4 & 0xf) & 1) != 0) break;
      uVar4 = uVar4 + 1;
      uVar5 = mVar1;
    } while (mVar1 != uVar4);
  }
  pmVar3 = sval->index;
  if (uVar5 < pmVar3->n_buckets) {
    do {
      puVar2 = (undefined8 *)pmVar3->p[uVar5]->data;
      printf("    %d: %s\n",(ulong)*(uint *)((long)puVar2 + 0xc),*puVar2);
      uVar4 = sval->index->n_buckets;
      if (uVar5 < uVar4) {
        do {
          uVar6 = uVar5 + 1;
          uVar5 = uVar4;
          if (uVar4 == uVar6) break;
          uVar5 = uVar6;
        } while ((sval->index->b[uVar6 >> 4] >> (uVar6 & 0xf) & 1) == 0);
      }
      pmVar3 = sval->index;
    } while (uVar5 < pmVar3->n_buckets);
  }
  return 0;
}

Assistant:

int dump_schema_index(struct tnt_schema_sval *sval) {
	mh_int_t ipos = 0;
	mh_foreach(sval->index, ipos) {
		struct tnt_schema_ival *ival = NULL;
		ival = (*mh_assoc_node(sval->index, ipos))->data;
		printf("    %d: %s\n", ival->number, ival->name);
	}
	return 0;
}